

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::compiler::Version::InternalSerializeWithCachedSizesToArray
          (Version *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->major_;
    *target = '\b';
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target[1] = (byte)uVar2;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      if (uVar2 < 0x4000) {
        target[2] = (uint8)uVar6;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar5 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar4);
        *puVar5 = (uint8)uVar7;
      }
    }
  }
  if ((uVar1 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->minor_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target[1] = (byte)uVar2;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      if (uVar2 < 0x4000) {
        target[2] = (uint8)uVar6;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar5 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar4);
        *puVar5 = (uint8)uVar7;
      }
    }
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->patch_;
    *target = '\x18';
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target[1] = (byte)uVar2;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      if (uVar2 < 0x4000) {
        target[2] = (uint8)uVar6;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar5 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar4);
        *puVar5 = (uint8)uVar7;
      }
    }
  }
  if ((uVar1 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,(this->suffix_).ptr_,target);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return target;
  }
  puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
  return puVar5;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Version::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 major = 1;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_major(), target);
  }

  // optional int32 minor = 2;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_minor(), target);
  }

  // optional int32 patch = 3;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_patch(), target);
  }

  // optional string suffix = 4;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_suffix().data(), static_cast<int>(this->_internal_suffix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.Version.suffix");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_suffix(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}